

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

uint8_t * o_xattr(wchar_t oid)

{
  object_kind *poVar1;
  uint *puVar2;
  uint8_t *puVar3;
  uint8_t **ppuVar4;
  
  poVar1 = objkind_byid(oid);
  if (poVar1 == (object_kind *)0x0) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    if ((poVar1->flavor == (flavor *)0x0) || (poVar1->aware == true)) {
      puVar2 = &poVar1->kidx;
      ppuVar4 = &kind_x_attr;
    }
    else {
      puVar2 = &poVar1->flavor->fidx;
      ppuVar4 = &flavor_x_attr;
    }
    puVar3 = *ppuVar4 + *puVar2;
  }
  return puVar3;
}

Assistant:

static uint8_t *o_xattr(int oid)
{
	struct object_kind *kind = objkind_byid(oid);
	if (!kind) return NULL;

	if (!kind->flavor || kind->aware)
		return &kind_x_attr[kind->kidx];
	else
		return &flavor_x_attr[kind->flavor->fidx];
}